

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

void __thiscall
OpenMD::Snapshot::Snapshot(Snapshot *this,int nAtoms,int nRigidbodies,int nCutoffGroups,bool usePBC)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  undefined8 local_88 [10];
  DataStorage *local_38;
  
  DataStorage::DataStorage(&this->atomData,(long)nAtoms,0);
  DataStorage::DataStorage(&this->rigidbodyData,(long)nRigidbodies,0);
  local_38 = &this->rigidbodyData;
  DataStorage::DataStorage(&this->cgData,(long)nCutoffGroups,1);
  (this->frameData).thermostat.first = 0.0;
  (this->frameData).thermostat.second = 0.0;
  (this->frameData).spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->frameData).spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar6 = 0;
  memset(&(this->frameData).hmat,0,0x120);
  (this->frameData).lrPotentials.data_[0] = 0.0;
  (this->frameData).lrPotentials.data_[1] = 0.0;
  (this->frameData).lrPotentials.data_[2] = 0.0;
  (this->frameData).lrPotentials.data_[3] = 0.0;
  (this->frameData).lrPotentials.data_[4] = 0.0;
  (this->frameData).lrPotentials.data_[5] = 0.0;
  (this->frameData).lrPotentials.data_[6] = 0.0;
  (this->frameData).selfPotentials.data_[0] = 0.0;
  (this->frameData).selfPotentials.data_[1] = 0.0;
  (this->frameData).selfPotentials.data_[2] = 0.0;
  (this->frameData).selfPotentials.data_[3] = 0.0;
  (this->frameData).selfPotentials.data_[4] = 0.0;
  (this->frameData).selfPotentials.data_[5] = 0.0;
  (this->frameData).selfPotentials.data_[6] = 0.0;
  (this->frameData).excludedPotentials.data_[0] = 0.0;
  (this->frameData).excludedPotentials.data_[1] = 0.0;
  (this->frameData).excludedPotentials.data_[2] = 0.0;
  (this->frameData).excludedPotentials.data_[3] = 0.0;
  (this->frameData).excludedPotentials.data_[4] = 0.0;
  (this->frameData).excludedPotentials.data_[5] = 0.0;
  (this->frameData).excludedPotentials.data_[6] = 0.0;
  (this->frameData).selectionPotentials.data_[0] = 0.0;
  (this->frameData).selectionPotentials.data_[1] = 0.0;
  (this->frameData).selectionPotentials.data_[2] = 0.0;
  (this->frameData).selectionPotentials.data_[3] = 0.0;
  (this->frameData).selectionPotentials.data_[4] = 0.0;
  (this->frameData).selectionPotentials.data_[5] = 0.0;
  (this->frameData).selectionPotentials.data_[6] = 0.0;
  memset(&(this->frameData).electronicThermostat,0,0xe8);
  memset(&(this->frameData).virialTensor,0,0x120);
  this->orthoTolerance_ = 1e-06;
  (this->frameData).id = -1;
  (this->frameData).currentTime = 0.0;
  local_88[8] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  do {
    *(undefined8 *)
     ((long)(this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
            data_[0] + lVar6 + 0x10) = *(undefined8 *)((long)local_88 + lVar6 + 0x10);
    uVar2 = *(undefined8 *)((long)local_88 + lVar6 + 8);
    puVar1 = (undefined8 *)
             ((long)(this->frameData).hmat.super_SquareMatrix<double,_3>.
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar6);
    *puVar1 = *(undefined8 *)((long)local_88 + lVar6);
    puVar1[1] = uVar2;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[8] = 0;
  lVar6 = 0;
  do {
    *(undefined8 *)
     ((long)(this->frameData).invHmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
            .data_[0] + lVar6 + 0x10) = *(undefined8 *)((long)local_88 + lVar6 + 0x10);
    uVar2 = *(undefined8 *)((long)local_88 + lVar6 + 8);
    puVar1 = (undefined8 *)
             ((long)(this->frameData).invHmat.super_SquareMatrix<double,_3>.
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar6);
    *puVar1 = *(undefined8 *)((long)local_88 + lVar6);
    puVar1[1] = uVar2;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  (this->frameData).orthoRhombic = false;
  (this->frameData).usePBC = usePBC;
  (this->frameData).bondPotential = 0.0;
  (this->frameData).bendPotential = 0.0;
  (this->frameData).torsionPotential = 0.0;
  (this->frameData).inversionPotential = 0.0;
  (this->frameData).lrPotentials.data_[0] = 0.0;
  (this->frameData).lrPotentials.data_[1] = 0.0;
  (this->frameData).lrPotentials.data_[2] = 0.0;
  (this->frameData).lrPotentials.data_[3] = 0.0;
  (this->frameData).lrPotentials.data_[4] = 0.0;
  (this->frameData).lrPotentials.data_[5] = 0.0;
  lVar6 = 0;
  (this->frameData).lrPotentials.data_[6] = 0.0;
  (this->frameData).reciprocalPotential = 0.0;
  (this->frameData).surfacePotential = 0.0;
  (this->frameData).selfPotentials.data_[0] = 0.0;
  (this->frameData).selfPotentials.data_[1] = 0.0;
  (this->frameData).selfPotentials.data_[2] = 0.0;
  (this->frameData).selfPotentials.data_[3] = 0.0;
  (this->frameData).selfPotentials.data_[4] = 0.0;
  (this->frameData).selfPotentials.data_[5] = 0.0;
  (this->frameData).selfPotentials.data_[6] = 0.0;
  (this->frameData).excludedPotentials.data_[0] = 0.0;
  (this->frameData).excludedPotentials.data_[1] = 0.0;
  (this->frameData).excludedPotentials.data_[2] = 0.0;
  (this->frameData).excludedPotentials.data_[3] = 0.0;
  (this->frameData).excludedPotentials.data_[4] = 0.0;
  (this->frameData).excludedPotentials.data_[5] = 0.0;
  (this->frameData).excludedPotentials.data_[6] = 0.0;
  (this->frameData).restraintPotential = 0.0;
  (this->frameData).rawPotential = 0.0;
  (this->frameData).yzArea = 0.0;
  (this->frameData).volume = 0.0;
  (this->frameData).xyArea = 0.0;
  (this->frameData).xzArea = 0.0;
  (this->frameData).thermostat.first = 0.0;
  (this->frameData).thermostat.second = 0.0;
  (this->frameData).electronicThermostat.first = 0.0;
  (this->frameData).electronicThermostat.second = 0.0;
  local_88[8] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  do {
    *(undefined8 *)
     ((long)(this->frameData).barostat.super_SquareMatrix<double,_3>.
            super_RectMatrix<double,_3U,_3U>.data_[0] + lVar6 + 0x10) =
         *(undefined8 *)((long)local_88 + lVar6 + 0x10);
    uVar2 = *(undefined8 *)((long)local_88 + lVar6 + 8);
    puVar1 = (undefined8 *)
             ((long)(this->frameData).barostat.super_SquareMatrix<double,_3>.
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar6);
    *puVar1 = *(undefined8 *)((long)local_88 + lVar6);
    puVar1[1] = uVar2;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[8] = 0;
  lVar6 = 0;
  do {
    *(undefined8 *)
     ((long)(this->frameData).virialTensor.super_SquareMatrix<double,_3>.
            super_RectMatrix<double,_3U,_3U>.data_[0] + lVar6 + 0x10) =
         *(undefined8 *)((long)local_88 + lVar6 + 0x10);
    uVar2 = *(undefined8 *)((long)local_88 + lVar6 + 8);
    puVar1 = (undefined8 *)
             ((long)(this->frameData).virialTensor.super_SquareMatrix<double,_3>.
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar6);
    *puVar1 = *(undefined8 *)((long)local_88 + lVar6);
    puVar1[1] = uVar2;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  (this->frameData).conductiveHeatFlux.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->frameData).conductiveHeatFlux.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->frameData).conductiveHeatFlux.super_Vector<double,_3U>.data_[2] = 0.0;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ffae0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  uVar2 = OpenMD::V3Zero._8_8_;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)OpenMD::V3Zero._0_8_;
  uVar4 = OpenMD::V3Zero._8_8_;
  OpenMD::V3Zero._8_4_ = (undefined4)uVar2;
  OpenMD::V3Zero._12_4_ = SUB84(uVar2,4);
  uVar3 = OpenMD::V3Zero._12_4_;
  p_Var5[1]._M_use_count = OpenMD::V3Zero._8_4_;
  OpenMD::V3Zero._8_8_ = uVar4;
  p_Var5[1]._M_weak_count = uVar3;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)OpenMD::V3Zero._16_8_;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  *(undefined4 *)&p_Var5[3]._vptr__Sp_counted_base = 0xffffffff;
  (this->frameData).spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  this_00 = (this->frameData).spfData.
            super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->frameData).spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  clearDerivedProperties(this);
  return;
}

Assistant:

Snapshot::Snapshot(int nAtoms, int nRigidbodies, int nCutoffGroups,
                     bool usePBC) :
      atomData(nAtoms),
      rigidbodyData(nRigidbodies),
      cgData(nCutoffGroups, DataStorage::dslPosition), orthoTolerance_(1e-6) {
    frameData.id                   = -1;
    frameData.currentTime          = 0;
    frameData.hmat                 = Mat3x3d(0.0);
    frameData.invHmat              = Mat3x3d(0.0);
    frameData.orthoRhombic         = false;
    frameData.usePBC               = usePBC;
    frameData.bondPotential        = 0.0;
    frameData.bendPotential        = 0.0;
    frameData.torsionPotential     = 0.0;
    frameData.inversionPotential   = 0.0;
    frameData.lrPotentials         = potVec(0.0);
    frameData.surfacePotential     = 0.0;
    frameData.reciprocalPotential  = 0.0;
    frameData.selfPotentials       = potVec(0.0);
    frameData.excludedPotentials   = potVec(0.0);
    frameData.restraintPotential   = 0.0;
    frameData.rawPotential         = 0.0;
    frameData.xyArea               = 0.0;
    frameData.xzArea               = 0.0;
    frameData.yzArea               = 0.0;
    frameData.volume               = 0.0;
    frameData.thermostat           = make_pair(0.0, 0.0);
    frameData.electronicThermostat = make_pair(0.0, 0.0);
    frameData.barostat             = Mat3x3d(0.0);
    frameData.virialTensor         = Mat3x3d(0.0);
    frameData.conductiveHeatFlux   = Vector3d(0.0, 0.0, 0.0);
    frameData.spfData              = std::make_shared<SPFData>();
    clearDerivedProperties();
  }